

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueCallbacks.cpp
# Opt level: O3

SNMP_ERROR_STATUS __thiscall
StringCallback::setTypeWithValue(StringCallback *this,BER_CONTAINER *rawValue)

{
  ulong uVar1;
  SNMP_ERROR_STATUS SVar2;
  
  if (this->value != (char **)0x0) {
    SVar2 = WRONG_LENGTH;
    uVar1._0_4_ = rawValue[1]._type;
    uVar1._4_4_ = rawValue[1]._length;
    if (uVar1 < this->max_len) {
      strncpy(*this->value,(char *)rawValue[1]._vptr_BER_CONTAINER,this->max_len);
      SVar2 = NO_ERROR;
    }
    return SVar2;
  }
  return GEN_ERR;
}

Assistant:

SNMP_ERROR_STATUS StringCallback::setTypeWithValue(BER_CONTAINER* rawValue){
    ASSERT_CALLBACK_SETTABLE();
    ASSERT_VALID_SETTABLE_VALUE(this->value);

    OctetType* val = static_cast<OctetType*>(rawValue);
    if(val->_value.length() >= this->max_len) return WRONG_LENGTH;
    strncpy(*this->value, val->_value.data(), this->max_len);

    return NO_ERROR;
}